

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderControlStatementTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Performance::ConditionalCase::init(ConditionalCase *this,EVP_PKEY_CTX *ctx)

{
  float fVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  size_type sVar5;
  reference pvVar6;
  value_type *__x;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  value_type local_7e4;
  float local_7c4;
  char *local_7b0;
  char *local_7a0;
  char *local_788;
  char *local_778;
  undefined1 *local_748;
  char *local_740;
  char *local_738;
  char *local_730;
  Vector<float,_4> local_720;
  Vector<float,_4> local_710;
  Vector<float,_4> local_700;
  Vector<float,_4> local_6f0;
  AttribSpec local_6e0;
  Vector<float,_4> local_680;
  Vector<float,_4> local_670;
  Vector<float,_4> local_660;
  Vector<float,_4> local_650;
  AttribSpec local_640;
  Vector<float,_4> local_5e0;
  Vector<float,_4> local_5d0;
  Vector<float,_4> local_5c0;
  Vector<float,_4> local_5b0;
  AttribSpec local_5a0;
  float local_53c;
  float local_538;
  float maxValue;
  float minValue;
  int i;
  int numVertices;
  int numComponents;
  Vector<float,_4> local_518;
  Vector<float,_4> local_508;
  Vector<float,_4> local_4f8;
  AttribSpec local_4e8;
  float local_484;
  string local_480 [4];
  float value;
  string local_460 [39];
  allocator<char> local_439;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  allocator<char> local_3d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  string local_350 [8];
  string condition;
  ostringstream *op;
  undefined1 local_318 [8];
  ostringstream frag;
  ostringstream vtx;
  char *compareValueStr;
  char *staticCompareValueStr;
  bool isConditionMixed;
  bool isConditionFalse;
  bool isConditionTrue;
  bool isAttributeCase;
  bool isUniformCase;
  bool isStaticCase;
  bool isVertexCase;
  ConditionalCase *this_local;
  
  bVar7 = (this->super_ControlStatementCase).super_ShaderPerformanceCase.m_caseType ==
          CASETYPE_VERTEX;
  bVar8 = this->m_decisionType == DECISION_UNIFORM;
  bVar9 = this->m_decisionType == DECISION_ATTRIBUTE;
  bVar10 = this->m_branchType == BRANCH_TRUE;
  bVar11 = this->m_branchType == BRANCH_MIXED;
  local_730 = "-1.0";
  if (bVar10) {
    local_730 = "1.0";
  }
  if (this->m_decisionType != DECISION_STATIC) {
    if (bVar8) {
      local_738 = "u_compareValue";
    }
    else {
      if (bVar7) {
        local_740 = "a_compareValue";
      }
      else {
        local_740 = "v_compareValue";
      }
      local_738 = local_740;
    }
    local_730 = local_738;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag.field_0x170);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_318);
  if (bVar7) {
    local_748 = &frag.field_0x170;
  }
  else {
    local_748 = local_318;
  }
  condition.field_2._8_8_ = local_748;
  std::operator<<((ostream *)&frag.field_0x170,"#version 300 es\n");
  std::operator<<((ostream *)&frag.field_0x170,"in highp vec4 a_position;\n");
  std::operator<<((ostream *)&frag.field_0x170,"in mediump vec4 a_value0;\n");
  std::operator<<((ostream *)&frag.field_0x170,"in mediump vec4 a_value1;\n");
  std::operator<<((ostream *)local_318,"#version 300 es\n");
  std::operator<<((ostream *)local_318,"layout(location = 0) out mediump vec4 o_color;\n");
  if (bVar9) {
    std::operator<<((ostream *)&frag.field_0x170,"in mediump float a_compareValue;\n");
  }
  else if (bVar8) {
    std::operator<<((ostream *)condition.field_2._8_8_,"uniform mediump float u_compareValue;\n");
  }
  if (bVar7) {
    std::operator<<((ostream *)&frag.field_0x170,"out mediump vec4 v_color;\n");
    std::operator<<((ostream *)local_318,"in mediump vec4 v_color;\n");
  }
  else {
    std::operator<<((ostream *)&frag.field_0x170,"out mediump vec4 v_value0;\n");
    std::operator<<((ostream *)&frag.field_0x170,"out mediump vec4 v_value1;\n");
    std::operator<<((ostream *)local_318,"in mediump vec4 v_value0;\n");
    std::operator<<((ostream *)local_318,"in mediump vec4 v_value1;\n");
    if (bVar9) {
      std::operator<<((ostream *)&frag.field_0x170,"out mediump float v_compareValue;\n");
      std::operator<<((ostream *)local_318,"in mediump float v_compareValue;\n");
    }
  }
  std::operator<<((ostream *)&frag.field_0x170,"\n");
  std::operator<<((ostream *)&frag.field_0x170,"void main()\n");
  std::operator<<((ostream *)&frag.field_0x170,"{\n");
  std::operator<<((ostream *)&frag.field_0x170,"\tgl_Position = a_position;\n");
  std::operator<<((ostream *)local_318,"\n");
  std::operator<<((ostream *)local_318,"void main()\n");
  std::operator<<((ostream *)local_318,"{\n");
  std::operator<<((ostream *)condition.field_2._8_8_,"\tmediump vec4 res;\n");
  std::__cxx11::string::string(local_350);
  if ((!bVar11) || (bVar7)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_438,"",&local_439);
    std::operator+(&local_418,&local_438,local_730);
    std::operator+(&local_3f8,&local_418," > 0.0");
    std::__cxx11::string::operator=(local_350,(string *)&local_3f8);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::__cxx11::string::~string((string *)&local_418);
    std::__cxx11::string::~string((string *)&local_438);
    std::allocator<char>::~allocator(&local_439);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d0,"",&local_3d1);
    std::operator+(&local_3b0,&local_3d0,"fract(");
    std::operator+(&local_390,&local_3b0,local_730);
    std::operator+(&local_370,&local_390,") < 0.5");
    std::__cxx11::string::operator=(local_350,(string *)&local_370);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&local_390);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::allocator<char>::~allocator(&local_3d1);
  }
  poVar4 = std::operator<<((ostream *)condition.field_2._8_8_,"\tif (");
  poVar4 = std::operator<<(poVar4,local_350);
  std::operator<<(poVar4,")\n");
  std::operator<<((ostream *)condition.field_2._8_8_,"\t{\n");
  std::operator<<((ostream *)condition.field_2._8_8_,"\t\t");
  if ((this->m_workloadDivision == WORKLOAD_DIVISION_EVEN) ||
     (this->m_workloadDivision == WORKLOAD_DIVISION_TRUE_HEAVY)) {
    if (bVar7) {
      local_778 = "a_value0";
    }
    else {
      local_778 = "v_value0";
    }
    writeConditionalWorkload((ostringstream *)condition.field_2._8_8_,"res",local_778);
  }
  else {
    poVar4 = std::operator<<((ostream *)condition.field_2._8_8_,"res = ");
    if (bVar7) {
      local_788 = "a_value0";
    }
    else {
      local_788 = "v_value0";
    }
    poVar4 = std::operator<<(poVar4,local_788);
    std::operator<<(poVar4,";");
  }
  std::operator<<((ostream *)condition.field_2._8_8_,"\n");
  std::operator<<((ostream *)condition.field_2._8_8_,"\t}\n");
  std::operator<<((ostream *)condition.field_2._8_8_,"\telse\n");
  std::operator<<((ostream *)condition.field_2._8_8_,"\t{\n");
  std::operator<<((ostream *)condition.field_2._8_8_,"\t\t");
  if ((this->m_workloadDivision == WORKLOAD_DIVISION_EVEN) ||
     (this->m_workloadDivision == WORKLOAD_DIVISION_FALSE_HEAVY)) {
    if (bVar7) {
      local_7a0 = "a_value1";
    }
    else {
      local_7a0 = "v_value1";
    }
    writeConditionalWorkload((ostringstream *)condition.field_2._8_8_,"res",local_7a0);
  }
  else {
    poVar4 = std::operator<<((ostream *)condition.field_2._8_8_,"res = ");
    if (bVar7) {
      local_7b0 = "a_value1";
    }
    else {
      local_7b0 = "v_value1";
    }
    poVar4 = std::operator<<(poVar4,local_7b0);
    std::operator<<(poVar4,";");
  }
  std::operator<<((ostream *)condition.field_2._8_8_,"\n");
  std::operator<<((ostream *)condition.field_2._8_8_,"\t}\n");
  if (bVar7) {
    std::operator<<((ostream *)&frag.field_0x170,"\tv_color = res;\n");
    std::operator<<((ostream *)local_318,"\to_color = v_color;\n");
  }
  else {
    if (bVar9) {
      std::operator<<((ostream *)&frag.field_0x170,"\tv_compareValue = a_compareValue;\n");
    }
    std::operator<<((ostream *)&frag.field_0x170,"\tv_value0 = a_value0;\n");
    std::operator<<((ostream *)&frag.field_0x170,"\tv_value1 = a_value1;\n");
    std::operator<<((ostream *)local_318,"\to_color = res;\n");
  }
  std::operator<<((ostream *)&frag.field_0x170,"}\n");
  std::operator<<((ostream *)local_318,"}\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=
            ((string *)
             &(this->super_ControlStatementCase).super_ShaderPerformanceCase.m_vertShaderSource,
             local_460);
  std::__cxx11::string::~string(local_460);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=
            ((string *)
             &(this->super_ControlStatementCase).super_ShaderPerformanceCase.m_fragShaderSource,
             local_480);
  std::__cxx11::string::~string(local_480);
  if (bVar9) {
    if (bVar11) {
      if (bVar7) {
        i = 4;
        iVar3 = deqp::gls::ShaderPerformanceCase::getGridWidth((ShaderPerformanceCase *)this);
        iVar2 = deqp::gls::ShaderPerformanceCase::getGridHeight((ShaderPerformanceCase *)this);
        minValue = (float)((iVar3 + 1) * (iVar2 + 1));
        std::vector<float,_std::allocator<float>_>::resize
                  (&this->m_comparisonValueArray,(long)((int)minValue * 4));
        for (maxValue = 0.0; fVar1 = maxValue,
            sVar5 = std::vector<float,_std::allocator<float>_>::size(&this->m_comparisonValueArray),
            (int)fVar1 < (int)sVar5; maxValue = (float)((int)maxValue + 1)) {
          if ((int)maxValue % 4 == 0) {
            local_7e4 = 1.0;
            if ((int)((long)((ulong)(uint)((int)((long)(int)maxValue / 4) >> 0x1f) << 0x20 |
                            (long)(int)maxValue / 4 & 0xffffffffU) % 2) != 0) {
              local_7e4 = -1.0;
            }
            pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                               (&this->m_comparisonValueArray,(long)(int)maxValue);
            *pvVar6 = local_7e4;
          }
          else {
            pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                               (&this->m_comparisonValueArray,(long)(int)maxValue);
            *pvVar6 = 0.0;
          }
        }
      }
      else {
        local_538 = 0.0;
        iVar3 = deqp::gls::ShaderPerformanceCase::getViewportWidth((ShaderPerformanceCase *)this);
        local_53c = (float)iVar3 * 0.5;
        tcu::Vector<float,_4>::Vector(&local_5b0,local_538,0.0,0.0,0.0);
        tcu::Vector<float,_4>::Vector(&local_5c0,local_53c,0.0,0.0,0.0);
        tcu::Vector<float,_4>::Vector(&local_5d0,local_538,0.0,0.0,0.0);
        tcu::Vector<float,_4>::Vector(&local_5e0,local_53c,0.0,0.0,0.0);
        deqp::gls::AttribSpec::AttribSpec
                  (&local_5a0,"a_compareValue",&local_5b0,&local_5c0,&local_5d0,&local_5e0);
        std::vector<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>::push_back
                  (&(this->super_ControlStatementCase).super_ShaderPerformanceCase.m_attributes,
                   &local_5a0);
        deqp::gls::AttribSpec::~AttribSpec(&local_5a0);
      }
    }
    else {
      local_7c4 = 1.0;
      if (!bVar10) {
        local_7c4 = -1.0;
      }
      local_484 = local_7c4;
      tcu::Vector<float,_4>::Vector(&local_4f8,local_7c4,0.0,0.0,0.0);
      tcu::Vector<float,_4>::Vector(&local_508,local_484,0.0,0.0,0.0);
      tcu::Vector<float,_4>::Vector(&local_518,local_484,0.0,0.0,0.0);
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&numVertices,local_484,0.0,0.0,0.0);
      deqp::gls::AttribSpec::AttribSpec
                (&local_4e8,"a_compareValue",&local_4f8,&local_508,&local_518,(Vec4 *)&numVertices);
      std::vector<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>::push_back
                (&(this->super_ControlStatementCase).super_ShaderPerformanceCase.m_attributes,
                 &local_4e8);
      deqp::gls::AttribSpec::~AttribSpec(&local_4e8);
    }
  }
  tcu::Vector<float,_4>::Vector(&local_650,0.0,0.1,0.2,0.3);
  tcu::Vector<float,_4>::Vector(&local_660,0.4,0.5,0.6,0.7);
  tcu::Vector<float,_4>::Vector(&local_670,0.8,0.9,1.0,1.1);
  tcu::Vector<float,_4>::Vector(&local_680,1.2,1.3,1.4,1.5);
  deqp::gls::AttribSpec::AttribSpec
            (&local_640,"a_value0",&local_650,&local_660,&local_670,&local_680);
  std::vector<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>::push_back
            (&(this->super_ControlStatementCase).super_ShaderPerformanceCase.m_attributes,&local_640
            );
  deqp::gls::AttribSpec::~AttribSpec(&local_640);
  tcu::Vector<float,_4>::Vector(&local_6f0,0.0,0.1,0.2,0.3);
  tcu::Vector<float,_4>::Vector(&local_700,0.4,0.5,0.6,0.7);
  tcu::Vector<float,_4>::Vector(&local_710,0.8,0.9,1.0,1.1);
  tcu::Vector<float,_4>::Vector(&local_720,1.2,1.3,1.4,1.5);
  deqp::gls::AttribSpec::AttribSpec
            (&local_6e0,"a_value1",&local_6f0,&local_700,&local_710,&local_720);
  __x = &local_6e0;
  std::vector<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>::push_back
            (&(this->super_ControlStatementCase).super_ShaderPerformanceCase.m_attributes,__x);
  deqp::gls::AttribSpec::~AttribSpec(&local_6e0);
  ControlStatementCase::init(&this->super_ControlStatementCase,(EVP_PKEY_CTX *)__x);
  std::__cxx11::string::~string(local_350);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_318);
  iVar3 = std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag.field_0x170);
  return iVar3;
}

Assistant:

void ConditionalCase::init (void)
{
	bool			isVertexCase		= m_caseType == CASETYPE_VERTEX;

	bool			isStaticCase		= m_decisionType == DECISION_STATIC;
	bool			isUniformCase		= m_decisionType == DECISION_UNIFORM;
	bool			isAttributeCase		= m_decisionType == DECISION_ATTRIBUTE;

	DE_ASSERT(isStaticCase || isUniformCase || isAttributeCase);

	bool			isConditionTrue		= m_branchType == BRANCH_TRUE;
	bool			isConditionFalse	= m_branchType == BRANCH_FALSE;
	bool			isConditionMixed	= m_branchType == BRANCH_MIXED;

	DE_ASSERT(isConditionTrue || isConditionFalse || isConditionMixed);
	DE_UNREF(isConditionFalse);

	DE_ASSERT(isAttributeCase || !isConditionMixed); // The branch taken can vary between executions only if using attribute input.

	const char*		staticCompareValueStr	= isConditionTrue	? "1.0" : "-1.0";
	const char*		compareValueStr			= isStaticCase		? staticCompareValueStr :
											  isUniformCase		? "u_compareValue" :
											  isVertexCase		? "a_compareValue" :
																  "v_compareValue";

	std::ostringstream	vtx;
	std::ostringstream	frag;
	std::ostringstream&	op		= isVertexCase ? vtx : frag;

	vtx << "#version 300 es\n";
	vtx << "in highp vec4 a_position;\n";	// Position attribute.
	vtx << "in mediump vec4 a_value0;\n";	// Input for workload calculations of "true" branch.
	vtx << "in mediump vec4 a_value1;\n";	// Input for workload calculations of "false" branch.

	frag << "#version 300 es\n";
	frag << "layout(location = 0) out mediump vec4 o_color;\n";

	// Value to be used in the conditional expression.
	if (isAttributeCase)
		vtx << "in mediump float a_compareValue;\n";
	else if (isUniformCase)
		op << "uniform mediump float u_compareValue;\n";

	// Varyings.
	if (isVertexCase)
	{
		vtx << "out mediump vec4 v_color;\n";
		frag << "in mediump vec4 v_color;\n";
	}
	else
	{
		vtx << "out mediump vec4 v_value0;\n";
		vtx << "out mediump vec4 v_value1;\n";
		frag << "in mediump vec4 v_value0;\n";
		frag << "in mediump vec4 v_value1;\n";

		if (isAttributeCase)
		{
			vtx << "out mediump float v_compareValue;\n";
			frag << "in mediump float v_compareValue;\n";
		}
	}

	vtx << "\n";
	vtx << "void main()\n";
	vtx << "{\n";
	vtx << "	gl_Position = a_position;\n";

	frag << "\n";
	frag << "void main()\n";
	frag << "{\n";

	op << "	mediump vec4 res;\n";

	string condition;

	if (isConditionMixed && !isVertexCase)
		condition = string("") + "fract(" + compareValueStr + ") < 0.5"; // Comparison result varies with high frequency.
	else
		condition = string("") + compareValueStr + " > 0.0";

	op << "	if (" << condition << ")\n";
	op << "	{\n";

	op << "\t\t";
	if (m_workloadDivision == WORKLOAD_DIVISION_EVEN || m_workloadDivision == WORKLOAD_DIVISION_TRUE_HEAVY)
		writeConditionalWorkload(op, "res", isVertexCase ? "a_value0" : "v_value0"); // Workload calculation for the "true" branch.
	else
		op << "res = " << (isVertexCase ? "a_value0" : "v_value0") << ";";
	op << "\n";

	op << "	}\n";
	op << "	else\n";
	op << "	{\n";

	op << "\t\t";
	if (m_workloadDivision == WORKLOAD_DIVISION_EVEN || m_workloadDivision == WORKLOAD_DIVISION_FALSE_HEAVY)
		writeConditionalWorkload(op, "res", isVertexCase ? "a_value1" : "v_value1"); // Workload calculations for the "false" branch.
	else
		op << "res = " << (isVertexCase ? "a_value1" : "v_value1") << ";";
	op << "\n";

	op << "	}\n";

	if (isVertexCase)
	{
		// Put result to color variable.
		vtx << "	v_color = res;\n";
		frag << "	o_color = v_color;\n";
	}
	else
	{
		// Transfer inputs to fragment shader through varyings.
		if (isAttributeCase)
			vtx << "	v_compareValue = a_compareValue;\n";
		vtx << "	v_value0 = a_value0;\n";
		vtx << "	v_value1 = a_value1;\n";

		frag << "	o_color = res;\n"; // Put result to color variable.
	}

	vtx << "}\n";
	frag << "}\n";

	m_vertShaderSource = vtx.str();
	m_fragShaderSource = frag.str();

	if (isAttributeCase)
	{
		if (!isConditionMixed)
		{
			// Every execution takes the same branch.

			float value = isConditionTrue ? +1.0f : -1.0f;
			m_attributes.push_back(AttribSpec("a_compareValue",	Vec4(value, 0.0f, 0.0f, 0.0f),
																Vec4(value, 0.0f, 0.0f, 0.0f),
																Vec4(value, 0.0f, 0.0f, 0.0f),
																Vec4(value, 0.0f, 0.0f, 0.0f)));
		}
		else if (isVertexCase)
		{
			// Vertex case, not every execution takes the same branch.

			const int	numComponents	= 4;
			int			numVertices		= (getGridWidth() + 1) * (getGridHeight() + 1);

			// setupProgram() will later bind this array as an attribute.
			m_comparisonValueArray.resize(numVertices * numComponents);

			// Make every second vertex take the true branch, and every second the false branch.
			for (int i = 0; i < (int)m_comparisonValueArray.size(); i++)
			{
				if (i % numComponents == 0)
					m_comparisonValueArray[i] = (i / numComponents) % 2 == 0 ? +1.0f : -1.0f;
				else
					m_comparisonValueArray[i] = 0.0f;
			}
		}
		else // isConditionMixed && !isVertexCase
		{
			// Fragment case, not every execution takes the same branch.
			// \note fract(a_compareValue) < 0.5 will be true for every second column of fragments.

			float minValue = 0.0f;
			float maxValue = (float)getViewportWidth()*0.5f;
			m_attributes.push_back(AttribSpec("a_compareValue",	Vec4(minValue, 0.0f, 0.0f, 0.0f),
																Vec4(maxValue, 0.0f, 0.0f, 0.0f),
																Vec4(minValue, 0.0f, 0.0f, 0.0f),
																Vec4(maxValue, 0.0f, 0.0f, 0.0f)));
		}
	}

	m_attributes.push_back(AttribSpec("a_value0",	Vec4(0.0f, 0.1f, 0.2f, 0.3f),
													Vec4(0.4f, 0.5f, 0.6f, 0.7f),
													Vec4(0.8f, 0.9f, 1.0f, 1.1f),
													Vec4(1.2f, 1.3f, 1.4f, 1.5f)));

	m_attributes.push_back(AttribSpec("a_value1",	Vec4(0.0f, 0.1f, 0.2f, 0.3f),
													Vec4(0.4f, 0.5f, 0.6f, 0.7f),
													Vec4(0.8f, 0.9f, 1.0f, 1.1f),
													Vec4(1.2f, 1.3f, 1.4f, 1.5f)));

	ControlStatementCase::init();
}